

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O3

void apx_dataElement_set_type_ref_ptr(apx_dataElement_t *self,apx_dataType_tag *ptr)

{
  apx_typeCode_t aVar1;
  
  if (self == (apx_dataElement_t *)0x0) {
    return;
  }
  aVar1 = self->type_code;
  if (aVar1 == '\x11') {
    if ((self->type_ref).name != (char *)0x0) {
      free((self->type_ref).name);
      aVar1 = self->type_code;
      goto LAB_00127181;
    }
  }
  else {
LAB_00127181:
    if (aVar1 == '\x12') goto LAB_0012718a;
  }
  self->type_code = '\x12';
LAB_0012718a:
  (self->type_ref).ptr = ptr;
  return;
}

Assistant:

void apx_dataElement_set_type_ref_ptr(apx_dataElement_t *self, struct apx_dataType_tag *ptr)
{
   if (self != 0)
   {
      if ( (self->type_code == APX_TYPE_CODE_REF_NAME) && (self->type_ref.name != 0) )
      {
         free(self->type_ref.name);
      }
      if (self->type_code != APX_TYPE_CODE_REF_PTR)
      {
         self->type_code = APX_TYPE_CODE_REF_PTR;
      }
      self->type_ref.ptr = ptr;
   }
}